

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetStaticLibraryFlags
          (cmLocalGenerator *this,string *flags,string *config,string *linkLanguage,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  string *psVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  allocator<char> local_59;
  string local_58;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_STATIC_LINKER_FLAGS",&local_59);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_58);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,psVar1);
  std::__cxx11::string::~string((string *)&local_58);
  if (config->_M_string_length != 0) {
    std::operator+(&local_58,"CMAKE_STATIC_LINKER_FLAGS_",config);
    psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,&local_58);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,psVar1);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"STATIC_LIBRARY_FLAGS",&local_59);
  pcVar2 = cmGeneratorTarget::GetProperty(target,&local_58);
  (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
  std::__cxx11::string::~string((string *)&local_58);
  if (config->_M_string_length != 0) {
    std::operator+(&local_58,"STATIC_LIBRARY_FLAGS_",config);
    pcVar2 = cmGeneratorTarget::GetProperty(target,&local_58);
    (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
    std::__cxx11::string::~string((string *)&local_58);
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  cmGeneratorTarget::GetStaticLibraryLinkOptions
            (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58,config,linkLanguage);
  AppendCompileOptions
            (this,flags,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  return;
}

Assistant:

void cmLocalGenerator::GetStaticLibraryFlags(std::string& flags,
                                             std::string const& config,
                                             std::string const& linkLanguage,
                                             cmGeneratorTarget* target)
{
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_STATIC_LINKER_FLAGS"));
  if (!config.empty()) {
    std::string name = "CMAKE_STATIC_LINKER_FLAGS_" + config;
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(name));
  }
  this->AppendFlags(flags, target->GetProperty("STATIC_LIBRARY_FLAGS"));
  if (!config.empty()) {
    std::string name = "STATIC_LIBRARY_FLAGS_" + config;
    this->AppendFlags(flags, target->GetProperty(name));
  }

  std::vector<std::string> options;
  target->GetStaticLibraryLinkOptions(options, config, linkLanguage);
  // STATIC_LIBRARY_OPTIONS are escaped.
  this->AppendCompileOptions(flags, options);
}